

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CEExecOptions.h
# Opt level: O2

void __thiscall CEExecOptions::AddIcrsPars(CEExecOptions *this)

{
  allocator local_4a;
  allocator local_49;
  string local_48;
  string local_28;
  
  std::__cxx11::string::string((string *)&local_28,"R,ra",&local_49);
  std::__cxx11::string::string
            ((string *)&local_48,"RA in ICRS coordinate frame (degrees)",&local_4a);
  CLOptions::AddDoubleParam(&this->super_CLOptions,&local_28,&local_48,0.0);
  std::__cxx11::string::~string((string *)&local_48);
  std::__cxx11::string::~string((string *)&local_28);
  std::__cxx11::string::string((string *)&local_28,"D,dec",&local_49);
  std::__cxx11::string::string
            ((string *)&local_48,"DEC in the ICRS coordinate frame (degrees)",&local_4a);
  CLOptions::AddDoubleParam(&this->super_CLOptions,&local_28,&local_48,0.0);
  std::__cxx11::string::~string((string *)&local_48);
  std::__cxx11::string::~string((string *)&local_28);
  return;
}

Assistant:

inline
void CEExecOptions::AddIcrsPars(void)
{
    AddDoubleParam("R,ra", "RA in ICRS coordinate frame (degrees)", 0.0);
    AddDoubleParam("D,dec", "DEC in the ICRS coordinate frame (degrees)", 0.0);
}